

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O1

Vec_Int_t * Bmc_ManBCoreCollectPivots(Gia_Man_t *p,char *pName,Vec_Int_t *vVarMap)

{
  byte *pbVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  int iVar5;
  long lVar6;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  __ptr = Bmc_ManBCoreReadPivots(pName);
  if (0 < p->nObjs) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pbVar1 = &p->pObjs->field_0x3 + lVar6;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0xc;
    } while (lVar4 < p->nObjs);
  }
  iVar5 = __ptr->nSize;
  if (0 < (long)iVar5) {
    piVar3 = __ptr->pArray;
    lVar4 = 0;
    do {
      iVar2 = piVar3[lVar4];
      if (((long)iVar2 < 1) || (p->nObjs <= iVar2)) {
        printf("Cannot find object with Id %d in the given AIG.\n");
      }
      else {
        *(ulong *)(p->pObjs + iVar2) = *(ulong *)(p->pObjs + iVar2) | 0x40000000;
      }
      lVar4 = lVar4 + 1;
    } while (iVar5 != lVar4);
  }
  if (1 < vVarMap->nSize) {
    iVar5 = 1;
    lVar4 = 0;
    do {
      iVar2 = vVarMap->pArray[lVar4 * 2];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((p->pObjs[iVar2].field_0x3 & 0x40) != 0) {
        Vec_IntPush(p_00,(int)lVar4);
      }
      lVar4 = lVar4 + 1;
      iVar5 = iVar5 + 2;
    } while (iVar5 < vVarMap->nSize);
  }
  if (0 < p->nObjs) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pbVar1 = &p->pObjs->field_0x3 + lVar4;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar6 < p->nObjs);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollectPivots( Gia_Man_t * p, char * pName, Vec_Int_t * vVarMap )
{
    Gia_Obj_t * pObj;
    int i, iVar, iFrame;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    Vec_Int_t * vVars = Bmc_ManBCoreReadPivots( pName );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntForEachEntry( vVars, iVar, i )
        if ( iVar > 0 && iVar < Gia_ManObjNum(p) )
            Gia_ManObj( p, iVar )->fMark0 = 1;
        else
            printf( "Cannot find object with Id %d in the given AIG.\n", iVar );
    Vec_IntForEachEntryDouble( vVarMap, iVar, iFrame, i )
        if ( Gia_ManObj( p, iVar )->fMark0 )
            Vec_IntPush( vPivots, Abc_Lit2Var(i) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntFree( vVars );
    return vPivots;
}